

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RPLIDAR.h
# Opt level: O3

int GetRawExpressScanDataResponseRPLIDAR
              (RPLIDAR *pRPLIDAR,uchar *esdataresponse,int nb_bytes_response)

{
  int iVar1;
  ssize_t sVar2;
  long lVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  size_t __n;
  ulong uVar7;
  long lVar8;
  char *__s;
  uint uVar9;
  uint uVar10;
  byte *pbVar11;
  CHRONO chrono;
  uchar recvbuf [1024];
  timespec local_490;
  timespec local_480;
  undefined8 local_470;
  undefined8 uStack_468;
  long local_460;
  long lStack_458;
  timespec local_450;
  int local_440;
  byte local_438 [1032];
  
  iVar1 = clock_getres(4,&local_450);
  if ((iVar1 == 0) && (iVar1 = clock_gettime(4,&local_480), iVar1 == 0)) {
    local_440 = 0;
    local_470 = 0;
    uStack_468 = 0;
    local_460 = 0;
    lStack_458 = 0;
  }
  memset(local_438,0,0x400);
  iVar1 = (pRPLIDAR->RS232Port).DevType;
  if (iVar1 - 1U < 4) {
    if (0 < nb_bytes_response) {
      iVar1 = (pRPLIDAR->RS232Port).s;
      uVar7 = 0;
      do {
        sVar2 = recv(iVar1,local_438 + uVar7,(long)(nb_bytes_response - (int)uVar7),0);
        if ((int)sVar2 < 1) goto LAB_0012cb99;
        uVar5 = (int)uVar7 + (int)sVar2;
        uVar7 = (ulong)uVar5;
      } while ((int)uVar5 < nb_bytes_response);
    }
  }
  else {
    if (iVar1 != 0) {
LAB_0012cb99:
      puts("Error reading data from a RPLIDAR. ");
      return 1;
    }
    if (nb_bytes_response != 0) {
      iVar1 = *(int *)&(pRPLIDAR->RS232Port).hDev;
      uVar7 = 0;
      do {
        sVar2 = read(iVar1,local_438 + uVar7,(ulong)(uint)(nb_bytes_response - (int)uVar7));
        if ((int)sVar2 < 1) goto LAB_0012cb99;
        uVar5 = (int)uVar7 + (int)sVar2;
        uVar7 = (ulong)uVar5;
      } while (uVar5 < (uint)nb_bytes_response);
    }
  }
  uVar5 = nb_bytes_response;
  do {
    uVar10 = 1;
    if (1 < (int)uVar5) {
      uVar10 = uVar5;
    }
    uVar6 = 0;
    pbVar11 = local_438;
    do {
      iVar1 = uVar5 - uVar6;
      uVar9 = nb_bytes_response - iVar1;
      if (uVar9 != 0 && iVar1 <= nb_bytes_response) goto LAB_0012c9f6;
      __s = "Warning : RPLIDAR bad sync1 or sync2. ";
      if ((byte)(pbVar11[1] >> 4 | *pbVar11 & 0xf0) == 0xa5) {
        if (nb_bytes_response < 3) {
          bVar4 = 0;
        }
        else {
          uVar7 = 0;
          bVar4 = 0;
          do {
            bVar4 = bVar4 ^ pbVar11[uVar7 + 2];
            uVar7 = uVar7 + 1;
          } while (nb_bytes_response - 2 != uVar7);
        }
        __s = "Warning : RPLIDAR bad ChkSum. ";
        if ((byte)(*pbVar11 & 0xf | pbVar11[1] << 4) == bVar4) {
          if (0 < (int)(uVar5 - (uVar6 + nb_bytes_response))) {
            puts("Warning getting data from a RPLIDAR : Unexpected data after a data response. ");
          }
          memcpy(esdataresponse,local_438,(long)nb_bytes_response);
          return 0;
        }
      }
      pbVar11 = pbVar11 + 1;
      puts(__s);
      uVar6 = uVar6 + 1;
    } while (uVar6 != uVar10);
    uVar9 = nb_bytes_response;
    if ((int)uVar10 < nb_bytes_response) {
      uVar9 = uVar10;
    }
    iVar1 = uVar5 - uVar10;
    uVar6 = uVar10;
LAB_0012c9f6:
    __n = (size_t)iVar1;
    memmove(local_438,local_438 + uVar6,__n);
    uVar5 = uVar9 + iVar1;
    if (0x3ff < (int)uVar5) {
      puts("Error reading data from a RPLIDAR : Invalid data. ");
      return 4;
    }
    iVar1 = (pRPLIDAR->RS232Port).DevType;
    if (iVar1 - 1U < 4) {
      if (0 < (int)uVar9) {
        iVar1 = (pRPLIDAR->RS232Port).s;
        uVar7 = 0;
        do {
          sVar2 = recv(iVar1,local_438 + uVar7 + __n,(long)(int)(uVar9 - (int)uVar7),0);
          if ((int)sVar2 < 1) goto LAB_0012cb99;
          uVar10 = (int)uVar7 + (int)sVar2;
          uVar7 = (ulong)uVar10;
        } while ((int)uVar10 < (int)uVar9);
      }
    }
    else {
      if (iVar1 != 0) goto LAB_0012cb99;
      if (uVar9 != 0) {
        iVar1 = *(int *)&(pRPLIDAR->RS232Port).hDev;
        uVar7 = 0;
        do {
          sVar2 = read(iVar1,local_438 + uVar7 + __n,(ulong)(uVar9 - (int)uVar7));
          if ((int)sVar2 < 1) goto LAB_0012cb99;
          uVar10 = (int)uVar7 + (int)sVar2;
          uVar7 = (ulong)uVar10;
        } while (uVar10 < uVar9);
      }
    }
    lVar8 = local_460;
    lVar3 = lStack_458;
    if (local_440 == 0) {
      clock_gettime(4,&local_490);
      lVar8 = ((local_490.tv_sec + local_460) - local_480.tv_sec) +
              (local_490.tv_nsec + lStack_458) / 1000000000;
      lVar3 = (local_490.tv_nsec + lStack_458) % 1000000000 - local_480.tv_nsec;
      if (lVar3 < 0) {
        lVar8 = lVar8 + ~((ulong)-lVar3 / 1000000000);
        lVar3 = lVar3 + 1000000000 + ((ulong)-lVar3 / 1000000000) * 1000000000;
      }
    }
    if (4.0 < (double)lVar3 / 1000000000.0 + (double)lVar8) {
      puts("Error reading data from a RPLIDAR : Data response timeout. ");
      return 2;
    }
  } while( true );
}

Assistant:

inline int GetRawExpressScanDataResponseRPLIDAR(RPLIDAR* pRPLIDAR, unsigned char* esdataresponse, int nb_bytes_response)
{
	unsigned char recvbuf[MAX_NB_BYTES_RPLIDAR];
	int BytesReceived = 0, recvbuflen = 0, res = EXIT_FAILURE, nbBytesToRequest = 0, nbBytesDiscarded = 0;
	unsigned char* ptr = NULL;
	CHRONO chrono;

	StartChrono(&chrono);

	// Prepare the buffers.
	memset(recvbuf, 0, sizeof(recvbuf));
	recvbuflen = MAX_NB_BYTES_RPLIDAR-1; // The last character must be a 0 to be a valid string for sscanf.
	BytesReceived = 0;

	// Suppose that there are not so many data to discard.
	// First try to get directly the desired data response...

	nbBytesToRequest = nb_bytes_response;
	if (ReadAllRS232Port(&pRPLIDAR->RS232Port, recvbuf, nbBytesToRequest) != EXIT_SUCCESS)
	{
		printf("Error reading data from a RPLIDAR. \n");
		return EXIT_FAILURE;
	}
	BytesReceived += nbBytesToRequest;

	for (;;)
	{
		res = FindExpressScanDataResponseRPLIDAR(recvbuf, BytesReceived, nb_bytes_response, &nbBytesToRequest, &ptr, &nbBytesDiscarded);
		if (res == EXIT_SUCCESS) break;
		if (res == EXIT_FAILURE)
		{
			nbBytesToRequest = min(nb_bytes_response, nbBytesDiscarded);
		}
		memmove(recvbuf, recvbuf+nbBytesDiscarded, BytesReceived-nbBytesDiscarded);
		BytesReceived -= nbBytesDiscarded;
		if (BytesReceived+nbBytesToRequest > recvbuflen)
		{
			printf("Error reading data from a RPLIDAR : Invalid data. \n");
			return EXIT_INVALID_DATA;
		}
		if (ReadAllRS232Port(&pRPLIDAR->RS232Port, recvbuf+BytesReceived, nbBytesToRequest) != EXIT_SUCCESS)
		{
			printf("Error reading data from a RPLIDAR. \n");
			return EXIT_FAILURE;
		}
		BytesReceived += nbBytesToRequest;
		if (GetTimeElapsedChronoQuick(&chrono) > TIMEOUT_MESSAGE_RPLIDAR)
		{
			printf("Error reading data from a RPLIDAR : Data response timeout. \n");
			return EXIT_TIMEOUT;
		}
	}

	if (BytesReceived-nbBytesDiscarded-nb_bytes_response > 0)
	{
		printf("Warning getting data from a RPLIDAR : Unexpected data after a data response. \n");
	}

	// Store the data...
	memcpy(esdataresponse, recvbuf, nb_bytes_response);

	return EXIT_SUCCESS;
}